

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteDlidxAppend(Fts5Index *p,Fts5SegWriter *pWriter,i64 iRowid)

{
  bool bVar1;
  i64 iVal_00;
  int local_50;
  i64 iPgno;
  i64 iFirst;
  Fts5DlidxWriter *pDlidx;
  i64 iVal;
  int bDone;
  int i;
  i64 iRowid_local;
  Fts5SegWriter *pWriter_local;
  Fts5Index *p_local;
  
  bVar1 = false;
  iVal._4_4_ = 0;
  while (p->rc == 0 && !bVar1) {
    iFirst = (i64)(pWriter->aDlidx + iVal._4_4_);
    if ((((Fts5DlidxWriter *)iFirst)->buf).n < p->pConfig->pgsz) {
      bVar1 = true;
    }
    else {
      *(((Fts5DlidxWriter *)iFirst)->buf).p = '\x01';
      fts5DataWrite(p,((long)pWriter->iSegid << 0x25) + 0x1000000000 + (long)iVal._4_4_ * 0x80000000
                      + (long)((Fts5DlidxWriter *)iFirst)->pgno,(((Fts5DlidxWriter *)iFirst)->buf).p
                    ,(((Fts5DlidxWriter *)iFirst)->buf).n);
      fts5WriteDlidxGrow(p,pWriter,iVal._4_4_ + 2);
      iFirst = (i64)(pWriter->aDlidx + iVal._4_4_);
      if ((p->rc == 0) && ((((Fts5DlidxWriter *)(iFirst + 0x20))->buf).n == 0)) {
        iVal_00 = fts5DlidxExtractFirstRowid(&((Fts5DlidxWriter *)iFirst)->buf);
        ((Fts5DlidxWriter *)(iFirst + 0x20))->pgno = ((Fts5DlidxWriter *)iFirst)->pgno;
        sqlite3Fts5BufferAppendVarint(&p->rc,&((Fts5DlidxWriter *)(iFirst + 0x20))->buf,0);
        sqlite3Fts5BufferAppendVarint
                  (&p->rc,&((Fts5DlidxWriter *)(iFirst + 0x20))->buf,
                   (long)((Fts5DlidxWriter *)iFirst)->pgno);
        sqlite3Fts5BufferAppendVarint(&p->rc,&((Fts5DlidxWriter *)(iFirst + 0x20))->buf,iVal_00);
        ((Fts5DlidxWriter *)(iFirst + 0x20))->bPrevValid = 1;
        ((Fts5DlidxWriter *)(iFirst + 0x20))->iPrev = iVal_00;
      }
      sqlite3Fts5BufferZero(&((Fts5DlidxWriter *)iFirst)->buf);
      ((Fts5DlidxWriter *)iFirst)->bPrevValid = 0;
      ((Fts5DlidxWriter *)iFirst)->pgno = ((Fts5DlidxWriter *)iFirst)->pgno + 1;
    }
    if (*(int *)(iFirst + 4) == 0) {
      if (iVal._4_4_ == 0) {
        local_50 = (pWriter->writer).pgno;
      }
      else {
        local_50 = *(int *)(iFirst + -0x20);
      }
      sqlite3Fts5BufferAppendVarint
                (&p->rc,(Fts5Buffer *)(iFirst + 0x10),(long)(int)(uint)((bVar1 ^ 0xffU) & 1));
      sqlite3Fts5BufferAppendVarint(&p->rc,(Fts5Buffer *)(iFirst + 0x10),(long)local_50);
      pDlidx = (Fts5DlidxWriter *)iRowid;
    }
    else {
      pDlidx = (Fts5DlidxWriter *)(iRowid - *(long *)(iFirst + 8));
    }
    sqlite3Fts5BufferAppendVarint(&p->rc,(Fts5Buffer *)(iFirst + 0x10),(i64)pDlidx);
    *(undefined4 *)(iFirst + 4) = 1;
    *(i64 *)(iFirst + 8) = iRowid;
    iVal._4_4_ = iVal._4_4_ + 1;
  }
  return;
}

Assistant:

static void fts5WriteDlidxAppend(
  Fts5Index *p, 
  Fts5SegWriter *pWriter, 
  i64 iRowid
){
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    i64 iVal;
    Fts5DlidxWriter *pDlidx = &pWriter->aDlidx[i];

    if( pDlidx->buf.n>=p->pConfig->pgsz ){
      /* The current doclist-index page is full. Write it to disk and push
      ** a copy of iRowid (which will become the first rowid on the next
      ** doclist-index leaf page) up into the next level of the b-tree 
      ** hierarchy. If the node being flushed is currently the root node,
      ** also push its first rowid upwards. */
      pDlidx->buf.p[0] = 0x01;    /* Not the root node */
      fts5DataWrite(p, 
          FTS5_DLIDX_ROWID(pWriter->iSegid, i, pDlidx->pgno),
          pDlidx->buf.p, pDlidx->buf.n
      );
      fts5WriteDlidxGrow(p, pWriter, i+2);
      pDlidx = &pWriter->aDlidx[i];
      if( p->rc==SQLITE_OK && pDlidx[1].buf.n==0 ){
        i64 iFirst = fts5DlidxExtractFirstRowid(&pDlidx->buf);

        /* This was the root node. Push its first rowid up to the new root. */
        pDlidx[1].pgno = pDlidx->pgno;
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, 0);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, pDlidx->pgno);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, iFirst);
        pDlidx[1].bPrevValid = 1;
        pDlidx[1].iPrev = iFirst;
      }

      sqlite3Fts5BufferZero(&pDlidx->buf);
      pDlidx->bPrevValid = 0;
      pDlidx->pgno++;
    }else{
      bDone = 1;
    }

    if( pDlidx->bPrevValid ){
      iVal = iRowid - pDlidx->iPrev;
    }else{
      i64 iPgno = (i==0 ? pWriter->writer.pgno : pDlidx[-1].pgno);
      assert( pDlidx->buf.n==0 );
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, !bDone);
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iPgno);
      iVal = iRowid;
    }

    sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iVal);
    pDlidx->bPrevValid = 1;
    pDlidx->iPrev = iRowid;
  }
}